

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O1

void free_flatten_example(flat_example *fec)

{
  if (fec != (flat_example *)0x0) {
    features::delete_v(&fec->fs);
    if (fec->tag_len != 0) {
      free(fec->tag);
    }
    free(fec);
    return;
  }
  return;
}

Assistant:

void free_flatten_example(flat_example* fec)
{
  // note: The label memory should be freed by by freeing the original example.
  if (fec)
  {
    fec->fs.delete_v();
    if (fec->tag_len > 0)
      free(fec->tag);
    free(fec);
  }
}